

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports-runtime.cpp
# Opt level: O0

char * rtosc::helpers::get_value_from_runtime
                 (void *runtime,Ports *ports,size_t loc_size,char *loc,char *buffer_with_port,
                 size_t buffersize,int cols_used)

{
  char *pcVar1;
  char *in_RCX;
  undefined8 in_RDX;
  RtData *in_RSI;
  char *in_RDI;
  char *in_R8;
  Ports *unaff_retaddr;
  CapturePretty d;
  size_t addr_len;
  undefined8 in_stack_ffffffffffffff18;
  int cols_used_00;
  char *in_stack_ffffffffffffff28;
  CapturePretty *in_stack_ffffffffffffff30;
  CapturePretty local_c8;
  ulong local_38;
  char *local_28;
  char *local_20;
  undefined1 base_dispatch;
  
  base_dispatch = (undefined1)((ulong)in_RDX >> 0x38);
  cols_used_00 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_28 = in_R8;
  local_20 = in_RCX;
  local_38 = strlen(in_R8);
  CapturePretty::CapturePretty
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(size_t)&local_c8,cols_used_00);
  local_c8.super_RtData.loc = local_20;
  local_c8.super_RtData.matches = 0;
  pcVar1 = local_28 + local_38;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  local_28[(local_38 & 0xfffffffffffffffc) + 4] = ',';
  local_c8.super_RtData.message = local_28;
  Ports::dispatch(unaff_retaddr,in_RDI,in_RSI,(bool)base_dispatch);
  pcVar1 = CapturePretty::value(&local_c8);
  CapturePretty::~CapturePretty((CapturePretty *)0x11c19c);
  return pcVar1;
}

Assistant:

const char* get_value_from_runtime(void* runtime, const Ports& ports,
                                   size_t loc_size, char* loc,
                                   char* buffer_with_port,
                                   std::size_t buffersize,
                                   int cols_used)
{
    std::size_t addr_len = strlen(buffer_with_port);

    // use the port buffer to print the result, but do not overwrite the
    // port name
    CapturePretty d(buffer_with_port + addr_len, buffersize - addr_len,
                    cols_used);
    d.obj = runtime;
    d.loc_size = loc_size;
    d.loc = loc;
    d.matches = 0;

    // does the message at least fit the arguments?
    assert(buffersize - addr_len >= 8);
    // append type
    memset(buffer_with_port + addr_len, 0, 8); // cover string end and arguments
    buffer_with_port[addr_len + (4-addr_len%4)] = ',';

    d.message = buffer_with_port;

    // buffer_with_port is a message in this call:
    ports.dispatch(buffer_with_port, d, false);

    return d.value();
}